

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O0

int __thiscall CVmObjDict::getp_add(CVmObjDict *this,vm_obj_id_t self,vm_val_t *val,uint *argc)

{
  int iVar1;
  CVmObject *pCVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CVmObjDict *this_00;
  vm_val_t *in_RDX;
  vm_val_t *in_RDI;
  vm_val_t ele_val;
  int idx;
  char *str;
  int lstcnt;
  CVmObject *objp;
  vm_prop_id_t voc_prop;
  vm_val_t str_val;
  vm_obj_id_t obj;
  uint *in_stack_ffffffffffffff80;
  undefined2 in_stack_ffffffffffffff88;
  vm_prop_id_t in_stack_ffffffffffffff8a;
  vm_obj_id_t in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  int iVar3;
  int in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  vm_obj_id_t in_stack_ffffffffffffff9c;
  vm_val_t *in_stack_ffffffffffffffa0;
  vm_val_t local_40;
  vm_obj_id_t local_2c;
  vm_val_t *local_20;
  
  local_20 = in_RDX;
  if ((getp_add(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_add(unsigned_int,vm_val_t*,unsigned_int*)::desc), iVar1 != 0
     )) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_add::desc,3);
    __cxa_guard_release(&getp_add(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)
                     CONCAT44(in_stack_ffffffffffffff8c,
                              CONCAT22(in_stack_ffffffffffffff8a,in_stack_ffffffffffffff88)),
                     in_stack_ffffffffffffff80,(CVmNativeCodeDesc *)in_RDI);
  if (iVar1 == 0) {
    local_2c = CVmBif::pop_obj_val();
    CVmStack::pop(&local_40);
    CVmBif::pop_propid_val();
    pCVar2 = vm_objp(0);
    iVar1 = (*pCVar2->_vptr_CVmObject[0x32])();
    if ((CONCAT44(extraout_var,iVar1) != 0) ||
       (iVar1 = (*pCVar2->_vptr_CVmObject[0x35])(), CONCAT44(extraout_var_00,iVar1) != 0)) {
      err_throw(0);
    }
    iVar1 = vm_val_t::is_listlike
                      ((vm_val_t *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    if ((iVar1 == 0) ||
       (iVar1 = vm_val_t::ll_length((vm_val_t *)
                                    CONCAT44(in_stack_ffffffffffffff8c,
                                             CONCAT22(in_stack_ffffffffffffff8a,
                                                      in_stack_ffffffffffffff88))), iVar1 < 0)) {
      this_00 = (CVmObjDict *)vm_val_t::get_as_string(in_RDI);
      if (this_00 == (CVmObjDict *)0x0) {
        err_throw(0);
      }
      add_word(this_00,in_stack_ffffffffffffff9c,
               (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff8c,in_stack_ffffffffffffff8a);
    }
    else {
      for (iVar3 = 1; iVar3 <= iVar1; iVar3 = iVar3 + 1) {
        vm_val_t::ll_index(in_stack_ffffffffffffffa0,
                           (vm_val_t *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
                           ,in_stack_ffffffffffffff94);
        in_stack_ffffffffffffffa0 = (vm_val_t *)vm_val_t::get_as_string(in_RDI);
        if (in_stack_ffffffffffffffa0 == (vm_val_t *)0x0) {
          err_throw(0);
        }
        add_word((CVmObjDict *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                 (char *)CONCAT44(in_stack_ffffffffffffff94,iVar3),in_stack_ffffffffffffff8c,
                 in_stack_ffffffffffffff8a);
      }
    }
    vm_val_t::set_nil(local_20);
  }
  return 1;
}

Assistant:

int CVmObjDict::getp_add(VMG_ vm_obj_id_t self, vm_val_t *val, uint *argc)
{
    vm_obj_id_t obj;
    vm_val_t str_val;
    vm_prop_id_t voc_prop;
    CVmObject *objp;
    int lstcnt;
    const char *str;
    static CVmNativeCodeDesc desc(3);

    /* check arguments */
    if (get_prop_check_argc(val, argc, &desc))
        return TRUE;

    /* pop the object, word string, and property ID arguments */
    obj = CVmBif::pop_obj_val(vmg0_);
    G_stk->pop(&str_val);
    voc_prop = CVmBif::pop_propid_val(vmg0_);

    /* ensure that the object value isn't a string or list */
    objp = vm_objp(vmg_ obj);
    if (objp->get_as_list() != 0 || objp->get_as_string(vmg0_) != 0)
        err_throw(VMERR_OBJ_VAL_REQD);

    /* if the string argument is a list, add each word from the list */
    if (str_val.is_listlike(vmg0_)
        && (lstcnt = str_val.ll_length(vmg0_)) >= 0)
    {
        /* iterate over the list, using 1-based indices */
        for (int idx = 1 ; idx <= lstcnt ; ++idx)
        {
            /* get the next value from the list */
            vm_val_t ele_val;
            str_val.ll_index(vmg_ &ele_val, idx);

            /* get the next string value */
            if ((str = ele_val.get_as_string(vmg0_)) == 0)
                err_throw(VMERR_STRING_VAL_REQD);

            /* set this string */
            add_word(vmg_ self, str, obj, voc_prop);
        }
    }
    else if ((str = str_val.get_as_string(vmg0_)) != 0)
    {
        /* add the string */
        add_word(vmg_ self, str, obj, voc_prop);
    }
    else
    {
        /* string value required */
        err_throw(VMERR_STRING_VAL_REQD);
    }

    /* there's no return value */
    val->set_nil();

    /* success */
    return TRUE;
}